

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# advancing_front.cc
# Opt level: O3

Node * __thiscall p2t::AdvancingFront::LocatePoint(AdvancingFront *this,Point *point)

{
  double dVar1;
  double dVar2;
  Node *pNVar3;
  Node *pNVar4;
  
  dVar1 = point->x;
  pNVar3 = this->search_node_;
  dVar2 = pNVar3->point->x;
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    if (dVar2 <= dVar1) {
      do {
        pNVar3 = pNVar3->next;
        if (pNVar3 == (Node *)0x0) {
          return (Node *)0x0;
        }
        pNVar4 = pNVar3;
      } while (pNVar3->point != point);
    }
    else {
      do {
        pNVar3 = pNVar3->prev;
        if (pNVar3 == (Node *)0x0) {
          return (Node *)0x0;
        }
        pNVar4 = pNVar3;
      } while (pNVar3->point != point);
    }
  }
  else {
    pNVar4 = pNVar3;
    if (((pNVar3->point != point) && (pNVar4 = pNVar3->prev, pNVar3->prev->point != point)) &&
       (pNVar4 = pNVar3->next, pNVar3->next->point != point)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/contrib/poly2tri/poly2tri/sweep/advancing_front.cc"
                    ,0x55,"Node *p2t::AdvancingFront::LocatePoint(const Point *)");
    }
  }
  this->search_node_ = pNVar4;
  return pNVar4;
}

Assistant:

Node* AdvancingFront::LocatePoint(const Point* point)
{
  const double px = point->x;
  Node* node = FindSearchNode(px);
  const double nx = node->point->x;

  if (px == nx) {
    if (point != node->point) {
      // We might have two nodes with same x value for a short time
      if (point == node->prev->point) {
        node = node->prev;
      } else if (point == node->next->point) {
        node = node->next;
      } else {
        assert(0);
      }
    }
  } else if (px < nx) {
    while ((node = node->prev) != NULL) {
      if (point == node->point) {
        break;
      }
    }
  } else {
    while ((node = node->next) != NULL) {
      if (point == node->point)
        break;
    }
  }
  if(node) search_node_ = node;
  return node;
}